

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerStep * sqlite3TriggerSelectStep(sqlite3 *db,Select *pSelect)

{
  TriggerStep *pTVar1;
  
  pTVar1 = (TriggerStep *)sqlite3DbMallocRaw(db,0x50);
  if (pTVar1 == (TriggerStep *)0x0) {
    sqlite3SelectDelete(db,pSelect);
    pTVar1 = (TriggerStep *)0x0;
  }
  else {
    pTVar1->op = '\0';
    pTVar1->orconf = '\0';
    *(undefined6 *)&pTVar1->field_0x2 = 0;
    pTVar1->pTrig = (Trigger *)0x0;
    pTVar1->pSelect = (Select *)0x0;
    (pTVar1->target).z = (char *)0x0;
    pTVar1->pNext = (TriggerStep *)0x0;
    pTVar1->pLast = (TriggerStep *)0x0;
    pTVar1->pExprList = (ExprList *)0x0;
    pTVar1->pIdList = (IdList *)0x0;
    *(undefined8 *)&(pTVar1->target).n = 0;
    pTVar1->pWhere = (Expr *)0x0;
    pTVar1->op = 't';
    pTVar1->orconf = 'c';
    pTVar1->pSelect = pSelect;
  }
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerSelectStep(sqlite3 *db, Select *pSelect){
  TriggerStep *pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep));
  if( pTriggerStep==0 ) {
    sqlite3SelectDelete(db, pSelect);
    return 0;
  }
  pTriggerStep->op = TK_SELECT;
  pTriggerStep->pSelect = pSelect;
  pTriggerStep->orconf = OE_Default;
  return pTriggerStep;
}